

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

_Bool ts_node_has_error(TSNode self)

{
  ulong uVar1;
  byte bVar2;
  _Bool _Var3;
  
  uVar1 = *self.id;
  if ((uVar1 & 1) == 0) {
    bVar2 = (byte)(*(uint *)(uVar1 + 0x2c) >> 7);
  }
  else {
    bVar2 = (byte)(uVar1 >> 5);
  }
  _Var3 = (_Bool)(bVar2 & 1);
  if (_Var3 == false && (uVar1 & 1) == 0) {
    _Var3 = *(int *)(uVar1 + 0x20) != 0;
  }
  return _Var3;
}

Assistant:

bool ts_node_has_error(TSNode self) {
  return ts_subtree_error_cost(ts_node__subtree(self)) > 0;
}